

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
kj::ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::truncate
          (ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *this,char *__file,
          __off_t __length)

{
  Tuple<kj::String,_kj::Array<unsigned_long>_> *pTVar1;
  int in_EAX;
  int extraout_EAX;
  TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::String,_kj::Array<unsigned_long>_> *this_00;
  
  pTVar1 = this->ptr;
  while (pTVar1 + (long)__file < this->pos) {
    this_00 = &this->pos[-1].impl;
    this->pos = (RemoveConst<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)this_00;
    kj::_::TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::String,_kj::Array<unsigned_long>_>::~TupleImpl
              (this_00);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }